

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorVirtualScriptFunctionInfo
               (SnapObject *snpObject,RecyclableObject *obj,InflateMap *inflator)

{
  SnapScriptFunctionInfo *snapFuncInfo;
  TTD_PTR_ID objid;
  Type *pTVar1;
  
  if (snpObject->SnapObjectTag != SnapGeneratorVirtualScriptFunction) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  snapFuncInfo = (SnapScriptFunctionInfo *)snpObject->AddtlSnapObjectInfo;
  DoAddtlValueInstantiation_SnapScriptFunctionInfoEx(snapFuncInfo,(ScriptFunction *)obj,inflator);
  objid = *(TTD_PTR_ID *)&snapFuncInfo[1].DebugFunctionName;
  if (objid != 0) {
    pTVar1 = (Type *)InflateMap::LookupObject(inflator,objid);
    Memory::Recycler::WBSetBit((char *)&obj[4].type);
    obj[4].type.ptr = pTVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&obj[4].type);
    return;
  }
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapGeneratorVirtualScriptFunctionInfo(const SnapObject *snpObject, Js::RecyclableObject *obj, InflateMap *inflator)
        {
            Js::GeneratorVirtualScriptFunction* fobj = reinterpret_cast<Js::GeneratorVirtualScriptFunction*>(obj);
            SnapGeneratorVirtualScriptFunctionInfo *sgvsf = SnapObjectGetAddtlInfoAs<SnapGeneratorVirtualScriptFunctionInfo *, SnapObjectType::SnapGeneratorVirtualScriptFunction>(snpObject);

            // fill in all the details of the base class
            DoAddtlValueInstantiation_SnapScriptFunctionInfoEx(sgvsf, fobj, inflator);

            if(sgvsf->realFunction != TTD_INVALID_PTR_ID)
            {
                fobj->SetRealGeneratorFunction(reinterpret_cast<Js::JavascriptGeneratorFunction*>(inflator->LookupObject(sgvsf->realFunction)));
            }
        }